

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

RealType __thiscall
OpenMD::ZConstraintForceModifier::getZTargetPos(ZConstraintForceModifier *this,int index)

{
  Molecule *this_00;
  Vector3d com;
  Vector3d local_20;
  
  this_00 = SimInfo::getMoleculeByGlobalIndex((this->super_ForceModifier).info_,index);
  Molecule::getCom(&local_20,this_00);
  return local_20.super_Vector<double,_3U>.data_[2];
}

Assistant:

RealType ZConstraintForceModifier::getZTargetPos(int index) {
    RealType zTargetPos;
#ifndef IS_MPI
    Molecule* mol = info_->getMoleculeByGlobalIndex(index);
    assert(mol);
    Vector3d com = mol->getCom();
    zTargetPos   = com[whichDirection];
#else
    int whichProc = info_->getMolToProc(index);
    if (whichProc == worldRank) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(index);
      Vector3d com  = mol->getCom();
      zTargetPos    = com[whichDirection];
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    } else {
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    }
#endif
    return zTargetPos;
  }